

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O2

size_t csv::internals::get_file_size(string_view filename)

{
  long lVar1;
  long lVar2;
  allocator<char> local_249;
  string local_248 [32];
  string_view filename_local;
  ifstream infile;
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_248,&filename_local,&local_249);
  std::ifstream::ifstream(&infile,local_248,_S_bin);
  std::__cxx11::string::~string(local_248);
  lVar1 = std::istream::tellg();
  std::istream::seekg((long)&infile,_S_beg);
  lVar2 = std::istream::tellg();
  std::ifstream::~ifstream(&infile);
  return lVar2 - lVar1;
}

Assistant:

CSV_INLINE size_t get_file_size(csv::string_view filename) {
            std::ifstream infile(std::string(filename), std::ios::binary);
            const auto start = infile.tellg();
            infile.seekg(0, std::ios::end);
            const auto end = infile.tellg();

            return end - start;
        }